

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

bool __thiscall kj::anon_unknown_9::DiskDirectory::tryRemove(DiskDirectory *this,PathPtr path)

{
  uint uVar1;
  bool bVar2;
  size_t in_RCX;
  StringPtr path_00;
  Array<char> local_38;
  PathPtr local_20;
  
  local_20.parts.size_ = path.parts.size_;
  local_20.parts.ptr = path.parts.ptr;
  uVar1 = (this->super_DiskHandle).fd.fd;
  PathPtr::toString((String *)&local_38,&local_20,false);
  if (local_38.size_ == 0) {
    local_38.ptr._0_4_ = 0x4706a1;
  }
  path_00.content.ptr = (char *)(local_38.size_ + (local_38.size_ == 0));
  path_00.content.size_ = in_RCX;
  bVar2 = rmrf((anon_unknown_9 *)(ulong)uVar1,(int)local_38.ptr,path_00);
  Array<char>::~Array(&local_38);
  return bVar2;
}

Assistant:

bool tryRemove(PathPtr path) const override {
    return DiskHandle::tryRemove(path);
  }